

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O2

RPCHelpMan * wallet::listreceivedbyaddress(void)

{
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffe938;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffe93c;
  undefined8 in_stack_ffffffffffffe940;
  undefined8 in_stack_ffffffffffffe948;
  undefined8 in_stack_ffffffffffffe950;
  _Manager_type in_stack_ffffffffffffe958;
  undefined8 in_stack_ffffffffffffe960;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe968;
  pointer in_stack_ffffffffffffe978;
  pointer pRVar4;
  pointer in_stack_ffffffffffffe980;
  pointer pRVar5;
  pointer in_stack_ffffffffffffe988;
  pointer pRVar6;
  _Vector_impl_data in_stack_ffffffffffffe990;
  undefined1 in_stack_ffffffffffffe9a8 [16];
  pointer in_stack_ffffffffffffe9b8;
  pointer pRVar7;
  pointer in_stack_ffffffffffffe9c0;
  pointer pRVar8;
  pointer in_stack_ffffffffffffe9c8;
  pointer pRVar9;
  undefined8 in_stack_ffffffffffffe9d0;
  pointer in_stack_ffffffffffffe9d8;
  pointer pRVar10;
  pointer in_stack_ffffffffffffe9e0;
  pointer pRVar11;
  pointer in_stack_ffffffffffffe9e8;
  undefined8 in_stack_ffffffffffffe9f0;
  pointer in_stack_ffffffffffffe9f8;
  pointer in_stack_ffffffffffffea00;
  pointer in_stack_ffffffffffffea08;
  undefined8 in_stack_ffffffffffffea10;
  pointer in_stack_ffffffffffffea18;
  allocator<char> local_15ca;
  allocator<char> local_15c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15c8;
  allocator<char> local_15aa;
  allocator<char> local_15a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15a8;
  allocator<char> local_158a;
  allocator<char> local_1589;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1588;
  allocator<char> local_156a;
  allocator<char> local_1569;
  RPCResults local_1568;
  allocator_type local_154d;
  allocator<char> local_154c;
  bool local_154b;
  allocator<char> local_154a;
  allocator<char> local_1549;
  allocator<char> local_1548;
  allocator<char> local_1547;
  allocator<char> local_1546;
  allocator<char> local_1545;
  allocator<char> local_1544;
  bool local_1543;
  allocator<char> local_1542;
  allocator<char> local_1541;
  int local_1540;
  allocator<char> local_1539;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1538;
  allocator<char> local_151a;
  allocator<char> local_1519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f8;
  string local_14d8;
  string local_14b8;
  string local_1498;
  string local_1478;
  string local_1458;
  string local_1438;
  string local_1418;
  string local_13f8;
  string local_13d8;
  string local_13b8;
  string local_1398;
  string local_1378;
  string local_1358;
  string local_1338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  char *local_1298;
  size_type local_1290;
  char local_1288 [8];
  undefined8 uStack_1280;
  string local_1278 [32];
  string local_1258 [32];
  RPCResult local_1238;
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  undefined8 local_1030 [4];
  RPCResult local_1010 [4];
  RPCResult local_df0;
  RPCResult local_d68;
  string local_ce0 [32];
  string local_cc0 [32];
  RPCResult local_ca0;
  string local_c18 [32];
  string local_bf8 [32];
  RPCResult local_bd8;
  RPCArgOptions local_b50;
  string local_b08 [32];
  UniValue local_ae8;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a90;
  string local_a30 [32];
  RPCArgOptions local_a10;
  string local_9c8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_9a8;
  undefined1 local_950;
  string local_948 [32];
  RPCArgOptions local_928;
  string local_8e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_8a0;
  string local_840 [32];
  RPCArgOptions local_820;
  string local_7d8 [32];
  UniValue local_7b8;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_760;
  string local_700 [32];
  RPCArgOptions local_6e0;
  string local_698 [32];
  UniValue local_678;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_620;
  string local_5c0 [32];
  RPCArg local_5a0 [4];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"listreceivedbyaddress",&local_1519);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nList balances by receiving address.\n",&local_151a);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"minconf",&local_1539);
  local_1540 = 1;
  UniValue::UniValue<int,_int,_true>(&local_678,&local_1540);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_620,&local_678);
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,"The minimum number of confirmations before payments are included.",
             &local_1541);
  local_6e0.oneline_description._M_dataplus._M_p = (pointer)&local_6e0.oneline_description.field_2;
  local_6e0.skip_type_check = false;
  local_6e0.oneline_description._M_string_length = 0;
  local_6e0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6e0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6e0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6e0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6e0._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe938;
  name._M_string_length = in_stack_ffffffffffffe940;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  name.field_2._8_8_ = in_stack_ffffffffffffe950;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe960;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe958;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe968;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe978;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe980;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe988;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe990._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe990._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe990._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe9a8;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffe9c0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9b8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe9c8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe9d0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  opts._0_8_ = in_stack_ffffffffffffe9d8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe9e8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffea08;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffea10;
  opts._64_8_ = in_stack_ffffffffffffea18;
  RPCArg::RPCArg(local_5a0,name,(Type)local_5c0,fallback,description_09,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"include_empty",&local_1542);
  local_1543 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_7b8,&local_1543);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_760,&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d8,"Whether to include addresses that haven\'t received any payments.",
             &local_1544);
  local_820.oneline_description._M_dataplus._M_p = (pointer)&local_820.oneline_description.field_2;
  local_820.skip_type_check = false;
  local_820.oneline_description._M_string_length = 0;
  local_820.oneline_description.field_2._M_local_buf[0] = '\0';
  local_820.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_820.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_820.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_820.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_820._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe938;
  name_00._M_string_length = in_stack_ffffffffffffe940;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe950;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe960;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe958;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe968;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe978;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe980;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe988;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe990._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe990._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe990._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe9a8;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffe9c0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9b8;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe9c8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe9d0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  opts_00._0_8_ = in_stack_ffffffffffffe9d8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe9e8;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffea08;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffea10;
  opts_00._64_8_ = in_stack_ffffffffffffea18;
  RPCArg::RPCArg(local_5a0 + 1,name_00,(Type)local_700,fallback_00,description_10,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"include_watchonly",&local_1545);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c0,"true for watch-only wallets, otherwise false",&local_1546);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_8a0,&local_8c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e0,"Whether to include watch-only addresses (see \'importaddress\')",&local_1547
            );
  local_928.oneline_description._M_dataplus._M_p = (pointer)&local_928.oneline_description.field_2;
  local_928.skip_type_check = false;
  local_928.oneline_description._M_string_length = 0;
  local_928.oneline_description.field_2._M_local_buf[0] = '\0';
  local_928.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_928.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_928.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_928.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_928._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe938;
  name_01._M_string_length = in_stack_ffffffffffffe940;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe950;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe960;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe958;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe968;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe978;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe980;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe988;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe990._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe990._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe990._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe9a8;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffe9c0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9b8;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe9c8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe9d0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  opts_01._0_8_ = in_stack_ffffffffffffe9d8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe9e8;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffea08;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffea10;
  opts_01._64_8_ = in_stack_ffffffffffffea18;
  RPCArg::RPCArg(local_5a0 + 2,name_01,(Type)local_840,fallback_01,description_11,opts_01);
  std::__cxx11::string::string<std::allocator<char>>(local_948,"address_filter",&local_1548);
  local_9a8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_950 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"If present and non-empty, only return information on this address.",
             &local_1549);
  local_a10.oneline_description._M_dataplus._M_p = (pointer)&local_a10.oneline_description.field_2;
  local_a10.skip_type_check = false;
  local_a10.oneline_description._M_string_length = 0;
  local_a10.oneline_description.field_2._M_local_buf[0] = '\0';
  local_a10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_a10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_a10.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_a10._58_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe938;
  name_02._M_string_length = in_stack_ffffffffffffe940;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  name_02.field_2._8_8_ = in_stack_ffffffffffffe950;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe960;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe958;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe968;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe978;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe980;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe988;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe990._M_start;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe990._M_finish;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe990._M_end_of_storage;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe9a8;
  description_12._M_string_length = (size_type)in_stack_ffffffffffffe9c0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9b8;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe9c8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe9d0;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  opts_02._0_8_ = in_stack_ffffffffffffe9d8;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe9e8;
  opts_02.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffea08;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffea10;
  opts_02._64_8_ = in_stack_ffffffffffffea18;
  RPCArg::RPCArg(local_5a0 + 3,name_02,(Type)local_948,fallback_02,description_12,opts_02);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a30,"include_immature_coinbase",&local_154a);
  local_154b = false;
  UniValue::UniValue<bool,_bool,_true>(&local_ae8,&local_154b);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_a90,&local_ae8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b08,"Include immature coinbase transactions.",&local_154c);
  local_b50.oneline_description._M_dataplus._M_p = (pointer)&local_b50.oneline_description.field_2;
  local_b50.skip_type_check = false;
  local_b50.oneline_description._M_string_length = 0;
  local_b50.oneline_description.field_2._M_local_buf[0] = '\0';
  local_b50.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b50.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_b50.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_b50.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_b50._58_8_ = 0;
  name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe938;
  name_03._M_string_length = in_stack_ffffffffffffe940;
  name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  name_03.field_2._8_8_ = in_stack_ffffffffffffe950;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe960;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe958;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe968;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe978;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe980;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe988;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe990._M_start;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe990._M_finish;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe990._M_end_of_storage;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe9a8;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffe9c0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9b8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe9c8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe9d0;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9e0;
  opts_03._0_8_ = in_stack_ffffffffffffe9d8;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe9e8;
  opts_03.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe9f0;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe9f8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea00;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffea08;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffea10;
  opts_03._64_8_ = in_stack_ffffffffffffea18;
  RPCArg::RPCArg(&local_180,name_03,(Type)local_a30,fallback_03,description_13,opts_03);
  __l._M_len = 5;
  __l._M_array = local_5a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1538,__l,&local_154d);
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"",&local_1569);
  std::__cxx11::string::string<std::allocator<char>>(local_c18,"",&local_156a);
  std::__cxx11::string::string<std::allocator<char>>(local_cc0,"",&local_1589);
  std::__cxx11::string::string<std::allocator<char>>(local_ce0,"",&local_158a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1030,"involvesWatchonly",&local_15a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1050,"Only returns true if imported addresses were involved in transaction",
             &local_15aa);
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  auVar1._4_8_ = in_stack_ffffffffffffe940;
  auVar1._0_4_ = in_stack_ffffffffffffe93c;
  auVar1._12_8_ = in_stack_ffffffffffffe948;
  auVar1._20_8_ = in_stack_ffffffffffffe950;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffe960;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description.field_2 = in_stack_ffffffffffffe968;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffe980;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffe978;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe988;
  RPCResult::RPCResult
            (local_1010,BOOL,(string)(auVar1 << 0x20),SUB81(local_1030,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1070,"address",&local_15c9);
  std::__cxx11::string::string<std::allocator<char>>(local_1090,"The receiving address",&local_15ca)
  ;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name._M_string_length = in_stack_ffffffffffffe940;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_00._M_string_length = in_stack_ffffffffffffe960;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_00.field_2 = in_stack_ffffffffffffe968;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe980;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe978;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe988;
  RPCResult::RPCResult(local_1010 + 1,STR,m_key_name,description_00,inner_00,SUB81(local_1070,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_10b0,"amount",(allocator<char> *)&stack0xffffffffffffea17);
  std::operator+(&local_10f0,"The total amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_10d0,&local_10f0," received by the address");
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_01._M_string_length = in_stack_ffffffffffffe960;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_01.field_2 = in_stack_ffffffffffffe968;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe980;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe978;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe988;
  RPCResult::RPCResult
            (local_1010 + 2,STR_AMOUNT,m_key_name_00,description_01,inner_01,SUB81(local_10b0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1110,"confirmations",(allocator<char> *)&stack0xffffffffffffe9f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1130,"The number of confirmations of the most recent transaction included",
             (allocator<char> *)&stack0xffffffffffffe9f6);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_02._M_string_length = in_stack_ffffffffffffe960;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_02.field_2 = in_stack_ffffffffffffe968;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe980;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe978;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe988;
  RPCResult::RPCResult(local_1010 + 3,NUM,m_key_name_01,description_02,inner_02,SUB81(local_1110,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1150,"label",(allocator<char> *)&stack0xffffffffffffe9d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1170,"The label of the receiving address. The default label is \"\"",
             (allocator<char> *)&stack0xffffffffffffe9d6);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_03._M_string_length = in_stack_ffffffffffffe960;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_03.field_2 = in_stack_ffffffffffffe968;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe980;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe978;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe988;
  RPCResult::RPCResult(&local_df0,STR,m_key_name_02,description_03,inner_03,SUB81(local_1150,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1190,"txids",(allocator<char> *)&stack0xffffffffffffe9b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11b0,"",(allocator<char> *)&stack0xffffffffffffe9b6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1258,"txid",(allocator<char> *)&stack0xffffffffffffe997);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1278,"The ids of transactions received with the address",
             (allocator<char> *)&stack0xffffffffffffe996);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_04._M_string_length = in_stack_ffffffffffffe960;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_04.field_2 = in_stack_ffffffffffffe968;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_1238,STR_HEX,m_key_name_03,description_04,inner_04,SUB81(local_1258,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1238;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe998,__l_00,
             (allocator_type *)&stack0xffffffffffffe977);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_05._M_string_length = in_stack_ffffffffffffe960;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_05.field_2._M_local_buf = in_stack_ffffffffffffe968._M_local_buf;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_d68,ARR,m_key_name_04,description_05,inner_05,SUB81(local_1190,0));
  __l_01._M_len = 6;
  __l_01._M_array = local_1010;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_15a8,__l_01,(allocator_type *)&stack0xffffffffffffe976);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_06._M_string_length = in_stack_ffffffffffffe960;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_06.field_2._M_local_buf = in_stack_ffffffffffffe968._M_local_buf;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_ca0,OBJ,m_key_name_05,description_06,inner_06,SUB81(local_cc0,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_ca0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1588,__l_02,(allocator_type *)&stack0xffffffffffffe975);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe93c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe940;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe948;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe950;
  description_07._M_string_length = in_stack_ffffffffffffe960;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe958;
  description_07.field_2 = in_stack_ffffffffffffe968;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_bd8,ARR,m_key_name_06,description_07,inner_07,SUB81(local_bf8,0));
  result._4_4_ = in_stack_ffffffffffffe93c;
  result.m_type = uVar3;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe940;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe948;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe950;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe958;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe960;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffe968;
  result._64_8_ = pRVar4;
  result.m_description._M_dataplus._M_p = (pointer)pRVar5;
  result.m_description._M_string_length = (size_type)pRVar6;
  result._88_24_ = in_stack_ffffffffffffe990;
  result.m_cond._8_16_ = in_stack_ffffffffffffe9a8;
  result.m_cond.field_2._8_8_ = pRVar7;
  RPCResults::RPCResults(&local_1568,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1358,"listreceivedbyaddress",
             (allocator<char> *)&stack0xffffffffffffe974);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1378,"",(allocator<char> *)&stack0xffffffffffffe973);
  HelpExampleCli(&local_1338,&local_1358,&local_1378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13b8,"listreceivedbyaddress",
             (allocator<char> *)&stack0xffffffffffffe972);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13d8,"6 true",(allocator<char> *)&stack0xffffffffffffe971);
  HelpExampleCli(&local_1398,&local_13b8,&local_13d8);
  std::operator+(&local_1318,&local_1338,&local_1398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1418,"listreceivedbyaddress",
             (allocator<char> *)&stack0xffffffffffffe970);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1438,"6 true true \"\" true",
             (allocator<char> *)&stack0xffffffffffffe96f);
  HelpExampleCli(&local_13f8,&local_1418,&local_1438);
  std::operator+(&local_12f8,&local_1318,&local_13f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1478,"listreceivedbyaddress",
             (allocator<char> *)&stack0xffffffffffffe96e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1498,"6, true, true",(allocator<char> *)&stack0xffffffffffffe96d);
  HelpExampleRpc(&local_1458,&local_1478,&local_1498);
  std::operator+(&local_12d8,&local_12f8,&local_1458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14d8,"listreceivedbyaddress",
             (allocator<char> *)&stack0xffffffffffffe96c);
  std::operator+(&local_1518,"6, true, true, \"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_14f8,&local_1518,"\", true");
  HelpExampleRpc(&local_14b8,&local_14d8,&local_14f8);
  std::operator+(&local_12b8,&local_12d8,&local_14b8);
  local_1298 = local_1288;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p == &local_12b8.field_2) {
    uStack_1280 = local_12b8.field_2._8_8_;
  }
  else {
    local_1298 = local_12b8._M_dataplus._M_p;
  }
  local_1290 = local_12b8._M_string_length;
  local_12b8._M_string_length = 0;
  local_12b8.field_2._M_local_buf[0] = '\0';
  description_08._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:240:9)>
       ::_M_invoke;
  description_08._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:240:9)>
                ::_M_manager;
  description_08.field_2 = in_stack_ffffffffffffe968;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar6;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar7;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe9a8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe9a8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar8;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe9d0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar9;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar10;
  fun._M_invoker = (_Invoker_type)pRVar11;
  local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffe940,&stack0xffffffffffffe948)),
             description_08,args,(RPCResults)in_stack_ffffffffffffe990,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe948);
  std::__cxx11::string::~string((string *)&local_1298);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::__cxx11::string::~string((string *)&local_14f8);
  std::__cxx11::string::~string((string *)&local_1518);
  std::__cxx11::string::~string((string *)&local_14d8);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::__cxx11::string::~string((string *)&local_1458);
  std::__cxx11::string::~string((string *)&local_1498);
  std::__cxx11::string::~string((string *)&local_1478);
  std::__cxx11::string::~string((string *)&local_12f8);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::__cxx11::string::~string((string *)&local_1438);
  std::__cxx11::string::~string((string *)&local_1418);
  std::__cxx11::string::~string((string *)&local_1318);
  std::__cxx11::string::~string((string *)&local_1398);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::__cxx11::string::~string((string *)&local_1338);
  std::__cxx11::string::~string((string *)&local_1378);
  std::__cxx11::string::~string((string *)&local_1358);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1568.m_results);
  RPCResult::~RPCResult(&local_bd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1588);
  RPCResult::~RPCResult(&local_ca0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15a8);
  lVar2 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1010[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe998);
  RPCResult::~RPCResult(&local_1238);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe978);
  std::__cxx11::string::~string(local_1278);
  std::__cxx11::string::~string(local_1258);
  std::__cxx11::string::~string(local_11b0);
  std::__cxx11::string::~string(local_1190);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe9b8);
  std::__cxx11::string::~string(local_1170);
  std::__cxx11::string::~string(local_1150);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe9d8);
  std::__cxx11::string::~string(local_1130);
  std::__cxx11::string::~string(local_1110);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe9f8);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::__cxx11::string::~string(local_10b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea18);
  std::__cxx11::string::~string(local_1090);
  std::__cxx11::string::~string(local_1070);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15c8);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string((string *)local_1030);
  std::__cxx11::string::~string(local_ce0);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_bf8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1538);
  lVar2 = 0x420;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_5a0[0].m_names._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x108;
  } while (lVar2 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_b50);
  std::__cxx11::string::~string(local_b08);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_a90);
  UniValue::~UniValue(&local_ae8);
  std::__cxx11::string::~string(local_a30);
  RPCArgOptions::~RPCArgOptions(&local_a10);
  std::__cxx11::string::~string(local_9c8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_9a8._M_first);
  std::__cxx11::string::~string(local_948);
  RPCArgOptions::~RPCArgOptions(&local_928);
  std::__cxx11::string::~string(local_8e0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string(local_840);
  RPCArgOptions::~RPCArgOptions(&local_820);
  std::__cxx11::string::~string(local_7d8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_760);
  UniValue::~UniValue(&local_7b8);
  std::__cxx11::string::~string(local_700);
  RPCArgOptions::~RPCArgOptions(&local_6e0);
  std::__cxx11::string::~string(local_698);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_620);
  UniValue::~UniValue(&local_678);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listreceivedbyaddress()
{
    return RPCHelpMan{"listreceivedbyaddress",
                "\nList balances by receiving address.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum number of confirmations before payments are included."},
                    {"include_empty", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether to include addresses that haven't received any payments."},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Whether to include watch-only addresses (see 'importaddress')"},
                    {"address_filter", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If present and non-empty, only return information on this address."},
                    {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase transactions."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction"},
                            {RPCResult::Type::STR, "address", "The receiving address"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " received by the address"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations of the most recent transaction included"},
                            {RPCResult::Type::STR, "label", "The label of the receiving address. The default label is \"\""},
                            {RPCResult::Type::ARR, "txids", "",
                            {
                                {RPCResult::Type::STR_HEX, "txid", "The ids of transactions received with the address"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listreceivedbyaddress", "")
            + HelpExampleCli("listreceivedbyaddress", "6 true")
            + HelpExampleCli("listreceivedbyaddress", "6 true true \"\" true")
            + HelpExampleRpc("listreceivedbyaddress", "6, true, true")
            + HelpExampleRpc("listreceivedbyaddress", "6, true, true, \"" + EXAMPLE_ADDRESS[0] + "\", true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    const bool include_immature_coinbase{request.params[4].isNull() ? false : request.params[4].get_bool()};

    LOCK(pwallet->cs_wallet);

    return ListReceived(*pwallet, request.params, false, include_immature_coinbase);
},
    };
}